

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

void Cba_ObjSetCopy(Cba_Ntk_t *p,int i,int x)

{
  char *__assertion;
  
  if (i < 1) {
    __assertion = "i>0";
  }
  else {
    if (0 < (p->vObjCopy).nSize) {
      Vec_IntFillExtra(&p->vObjCopy,i + 1,-1);
      if ((p->vObjCopy).nSize <= i) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vObjCopy).pArray[(uint)i] == -1) {
        Vec_IntFillExtra(&p->vObjCopy,i + 1,0);
        if (i < (p->vObjCopy).nSize) {
          (p->vObjCopy).pArray[(uint)i] = x;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __assert_fail("Cba_ObjCopy(p, i) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x164,"void Cba_ObjSetCopy(Cba_Ntk_t *, int, int)");
    }
    __assertion = "Cba_NtkHasObjCopies(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x15b,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_ObjCopy( Cba_Ntk_t * p, int i )             { assert(i>0); assert( Cba_NtkHasObjCopies(p) ); return Vec_IntGetEntryFull(&p->vObjCopy, i); }